

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O2

wchar_t ismode_w(wchar_t *start,wchar_t *end,wchar_t *permset)

{
  wchar_t wVar1;
  wchar_t wVar2;
  uint uVar3;
  ulong uVar4;
  
  if (start < end) {
    wVar2 = L'\0';
    while( true ) {
      *permset = wVar2;
      do {
        if (end <= start) {
          return L'\x01';
        }
        wVar1 = *start;
        start = start + 1;
      } while (wVar1 == L'-');
      uVar3 = wVar1 + L'\xffffffae';
      uVar4 = (ulong)uVar3;
      if (0x26 < uVar3) break;
      if ((0x100000001U >> (uVar4 & 0x3f) & 1) == 0) {
        if ((0x2000000020U >> (uVar4 & 0x3f) & 1) == 0) {
          if ((0x4000000040U >> (uVar4 & 0x3f) & 1) == 0) {
            return L'\0';
          }
          uVar3 = 1;
        }
        else {
          uVar3 = 2;
        }
      }
      else {
        uVar3 = 4;
      }
      wVar2 = wVar2 | uVar3;
    }
  }
  return L'\0';
}

Assistant:

static int
ismode_w(const wchar_t *start, const wchar_t *end, int *permset)
{
	const wchar_t *p;

	if (start >= end)
		return (0);
	p = start;
	*permset = 0;
	while (p < end) {
		switch (*p++) {
		case 'r': case 'R':
			*permset |= ARCHIVE_ENTRY_ACL_READ;
			break;
		case 'w': case 'W':
			*permset |= ARCHIVE_ENTRY_ACL_WRITE;
			break;
		case 'x': case 'X':
			*permset |= ARCHIVE_ENTRY_ACL_EXECUTE;
			break;
		case '-':
			break;
		default:
			return (0);
		}
	}
	return (1);
}